

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Reader::readObject(Reader *this,Token *tokenStart)

{
  bool bVar1;
  Value *this_00;
  ulong uVar2;
  long in_RSI;
  long in_RDI;
  bool finalizeTokenOk;
  Token comma;
  bool ok;
  Value *value;
  Token colon;
  Value numberName;
  bool initialTokenOk;
  string name;
  Token tokenName;
  undefined4 in_stack_fffffffffffffdf8;
  TokenType in_stack_fffffffffffffdfc;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  string *in_stack_fffffffffffffe08;
  string *message;
  undefined5 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe15;
  undefined1 in_stack_fffffffffffffe16;
  undefined1 in_stack_fffffffffffffe17;
  undefined8 in_stack_fffffffffffffe18;
  allocator *paVar3;
  undefined5 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe25;
  undefined1 in_stack_fffffffffffffe26;
  undefined1 in_stack_fffffffffffffe27;
  Value *in_stack_fffffffffffffe30;
  char local_1b2;
  Value *in_stack_fffffffffffffe68;
  string local_190 [38];
  bool local_16a;
  allocator local_169;
  string local_168 [32];
  int local_148;
  string *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  byte in_stack_fffffffffffffed7;
  Reader *in_stack_fffffffffffffed8;
  allocator local_111;
  string local_110 [32];
  int local_f0;
  string local_d8 [16];
  Reader *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff78;
  char cVar4;
  undefined4 in_stack_ffffffffffffff7c;
  Token *in_stack_ffffffffffffff80;
  Reader *in_stack_ffffffffffffff88;
  string local_50 [32];
  int local_30;
  long local_18;
  byte local_1;
  
  local_18 = in_RSI;
  std::__cxx11::string::string(local_50);
  Value::Value((Value *)CONCAT17(in_stack_fffffffffffffe17,
                                 CONCAT16(in_stack_fffffffffffffe16,
                                          CONCAT15(in_stack_fffffffffffffe15,
                                                   in_stack_fffffffffffffe10))),
               (ValueType)((ulong)in_stack_fffffffffffffe08 >> 0x20));
  currentValue((Reader *)0x121e5f);
  Value::operator=((Value *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                   (Value *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  Value::~Value(in_stack_fffffffffffffe30);
  this_00 = currentValue((Reader *)0x121e91);
  Value::setOffsetStart(this_00,*(long *)(local_18 + 8) - *(long *)(in_RDI + 0xc0));
  while (bVar1 = readToken((Reader *)
                           CONCAT17(in_stack_fffffffffffffe17,
                                    CONCAT16(in_stack_fffffffffffffe16,
                                             CONCAT15(in_stack_fffffffffffffe15,
                                                      in_stack_fffffffffffffe10))),
                           (Token *)in_stack_fffffffffffffe08), bVar1) {
    in_stack_ffffffffffffff78 = CONCAT13(1,(int3)in_stack_ffffffffffffff78);
    while( true ) {
      local_1b2 = '\0';
      cVar4 = (char)((uint)in_stack_ffffffffffffff78 >> 0x18);
      if (local_30 == 0xc) {
        local_1b2 = cVar4;
      }
      if (local_1b2 == '\0') break;
      bVar1 = readToken((Reader *)
                        CONCAT17(in_stack_fffffffffffffe17,
                                 CONCAT16(in_stack_fffffffffffffe16,
                                          CONCAT15(in_stack_fffffffffffffe15,
                                                   in_stack_fffffffffffffe10))),
                        (Token *)in_stack_fffffffffffffe08);
      in_stack_ffffffffffffff78 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff78);
    }
    if (cVar4 == '\0') break;
    if ((local_30 == 2) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) != 0)) {
      local_1 = 1;
      goto LAB_0012256b;
    }
    std::__cxx11::string::operator=(local_50,"");
    if (local_30 == 5) {
      bVar1 = decodeString(in_stack_fffffffffffffed8,
                           (Token *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                           in_stack_fffffffffffffec8);
      if (!bVar1) {
        local_1 = recoverFromError((Reader *)
                                   CONCAT17(in_stack_fffffffffffffe27,
                                            CONCAT16(in_stack_fffffffffffffe26,
                                                     CONCAT15(in_stack_fffffffffffffe25,
                                                              in_stack_fffffffffffffe20))),
                                   (TokenType)((ulong)in_stack_fffffffffffffe18 >> 0x20));
        goto LAB_0012256b;
      }
    }
    else {
      if ((local_30 != 6) || ((*(byte *)(in_RDI + 0x10b) & 1) == 0)) break;
      Value::Value((Value *)CONCAT17(in_stack_fffffffffffffe17,
                                     CONCAT16(in_stack_fffffffffffffe16,
                                              CONCAT15(in_stack_fffffffffffffe15,
                                                       in_stack_fffffffffffffe10))),
                   (ValueType)((ulong)in_stack_fffffffffffffe08 >> 0x20));
      bVar1 = decodeNumber(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                           (Value *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      if (bVar1) {
        Value::asString_abi_cxx11_(in_stack_fffffffffffffe68);
        std::__cxx11::string::operator=(local_50,local_d8);
        std::__cxx11::string::~string(local_d8);
      }
      else {
        local_1 = recoverFromError((Reader *)
                                   CONCAT17(in_stack_fffffffffffffe27,
                                            CONCAT16(in_stack_fffffffffffffe26,
                                                     CONCAT15(in_stack_fffffffffffffe25,
                                                              in_stack_fffffffffffffe20))),
                                   (TokenType)((ulong)in_stack_fffffffffffffe18 >> 0x20));
      }
      Value::~Value(in_stack_fffffffffffffe30);
      if (!bVar1) goto LAB_0012256b;
    }
    bVar1 = readToken((Reader *)
                      CONCAT17(in_stack_fffffffffffffe17,
                               CONCAT16(in_stack_fffffffffffffe16,
                                        CONCAT15(in_stack_fffffffffffffe15,in_stack_fffffffffffffe10
                                                ))),(Token *)in_stack_fffffffffffffe08);
    if ((!bVar1) || (local_f0 != 0xb)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_110,"Missing \':\' after object member name",&local_111);
      local_1 = addErrorAndRecover((Reader *)
                                   CONCAT17(in_stack_fffffffffffffe17,
                                            CONCAT16(in_stack_fffffffffffffe16,
                                                     CONCAT15(in_stack_fffffffffffffe15,
                                                              in_stack_fffffffffffffe10))),
                                   in_stack_fffffffffffffe08,
                                   (Token *)CONCAT17(in_stack_fffffffffffffe07,
                                                     in_stack_fffffffffffffe00),
                                   in_stack_fffffffffffffdfc);
      std::__cxx11::string::~string(local_110);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
      goto LAB_0012256b;
    }
    in_stack_fffffffffffffe30 = currentValue((Reader *)0x122265);
    in_stack_fffffffffffffed8 =
         (Reader *)
         Value::operator[]((Value *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                           (string *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::push
              ((stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_> *)
               CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
               (value_type *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    in_stack_fffffffffffffe27 = readValue(in_stack_ffffffffffffff38);
    in_stack_fffffffffffffed7 = in_stack_fffffffffffffe27;
    std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::pop
              ((stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_> *)
               0x1222dd);
    if ((in_stack_fffffffffffffed7 & 1) == 0) {
      local_1 = recoverFromError((Reader *)
                                 CONCAT17(in_stack_fffffffffffffe27,
                                          CONCAT16(in_stack_fffffffffffffe26,
                                                   CONCAT15(in_stack_fffffffffffffe25,
                                                            in_stack_fffffffffffffe20))),
                                 (TokenType)((ulong)in_stack_fffffffffffffe18 >> 0x20));
      goto LAB_0012256b;
    }
    in_stack_fffffffffffffe25 =
         readToken((Reader *)
                   CONCAT17(in_stack_fffffffffffffe17,
                            CONCAT16(in_stack_fffffffffffffe16,
                                     CONCAT15(in_stack_fffffffffffffe15,in_stack_fffffffffffffe10)))
                   ,(Token *)in_stack_fffffffffffffe08);
    if ((!(bool)in_stack_fffffffffffffe25) ||
       (((local_148 != 2 && (local_148 != 10)) && (local_148 != 0xc)))) {
      paVar3 = &local_169;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_168,"Missing \',\' or \'}\' in object declaration",paVar3);
      local_1 = addErrorAndRecover((Reader *)
                                   CONCAT17(in_stack_fffffffffffffe17,
                                            CONCAT16(in_stack_fffffffffffffe16,
                                                     CONCAT15(in_stack_fffffffffffffe15,
                                                              in_stack_fffffffffffffe10))),
                                   in_stack_fffffffffffffe08,
                                   (Token *)CONCAT17(in_stack_fffffffffffffe07,
                                                     in_stack_fffffffffffffe00),
                                   in_stack_fffffffffffffdfc);
      std::__cxx11::string::~string(local_168);
      std::allocator<char>::~allocator((allocator<char> *)&local_169);
      goto LAB_0012256b;
    }
    local_16a = true;
    while( true ) {
      bVar1 = false;
      if (local_148 == 0xc) {
        bVar1 = local_16a;
      }
      if (bVar1 == false) break;
      in_stack_fffffffffffffe15 =
           readToken((Reader *)
                     CONCAT17(in_stack_fffffffffffffe17,
                              CONCAT16(bVar1,CONCAT15(in_stack_fffffffffffffe15,
                                                      in_stack_fffffffffffffe10))),
                     (Token *)in_stack_fffffffffffffe08);
      local_16a = (bool)in_stack_fffffffffffffe15;
    }
    if (local_148 == 2) {
      local_1 = 1;
      goto LAB_0012256b;
    }
    in_stack_fffffffffffffe16 = 0;
  }
  message = (string *)&stack0xfffffffffffffe6f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"Missing \'}\' or object member name",(allocator *)message)
  ;
  local_1 = addErrorAndRecover((Reader *)
                               CONCAT17(in_stack_fffffffffffffe17,
                                        CONCAT16(in_stack_fffffffffffffe16,
                                                 CONCAT15(in_stack_fffffffffffffe15,
                                                          in_stack_fffffffffffffe10))),message,
                               (Token *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00
                                                ),in_stack_fffffffffffffdfc);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe6f);
LAB_0012256b:
  std::__cxx11::string::~string(local_50);
  return (bool)(local_1 & 1);
}

Assistant:

bool Reader::readObject(Token& tokenStart) {
  Token tokenName;
  std::string name;
  currentValue() = Value(objectValue);
  currentValue().setOffsetStart(tokenStart.start_ - begin_);
  while (readToken(tokenName)) {
    bool initialTokenOk = true;
    while (tokenName.type_ == tokenComment && initialTokenOk)
      initialTokenOk = readToken(tokenName);
    if (!initialTokenOk)
      break;
    if (tokenName.type_ == tokenObjectEnd && name.empty()) // empty object
      return true;
    name = "";
    if (tokenName.type_ == tokenString) {
      if (!decodeString(tokenName, name))
        return recoverFromError(tokenObjectEnd);
    } else if (tokenName.type_ == tokenNumber && features_.allowNumericKeys_) {
      Value numberName;
      if (!decodeNumber(tokenName, numberName))
        return recoverFromError(tokenObjectEnd);
      name = numberName.asString();
    } else {
      break;
    }

    Token colon;
    if (!readToken(colon) || colon.type_ != tokenMemberSeparator) {
      return addErrorAndRecover(
          "Missing ':' after object member name", colon, tokenObjectEnd);
    }
    Value& value = currentValue()[name];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenObjectEnd);

    Token comma;
    if (!readToken(comma) ||
        (comma.type_ != tokenObjectEnd && comma.type_ != tokenArraySeparator &&
         comma.type_ != tokenComment)) {
      return addErrorAndRecover(
          "Missing ',' or '}' in object declaration", comma, tokenObjectEnd);
    }
    bool finalizeTokenOk = true;
    while (comma.type_ == tokenComment && finalizeTokenOk)
      finalizeTokenOk = readToken(comma);
    if (comma.type_ == tokenObjectEnd)
      return true;
  }
  return addErrorAndRecover(
      "Missing '}' or object member name", tokenName, tokenObjectEnd);
}